

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

bool __thiscall
QSqlQueryModel::insertColumns(QSqlQueryModel *this,int column,int count,QModelIndex *parent)

{
  QMetaType type;
  bool bVar1;
  int iVar2;
  int iVar3;
  QSqlQueryModelPrivate *pQVar4;
  reference pvVar5;
  size_type sVar6;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qsizetype i;
  int c;
  QSqlQueryModelPrivate *d;
  int nVal;
  QSqlField field;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QSqlField *in_stack_ffffffffffffff30;
  QModelIndex *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  value_type_conflict3 in_stack_ffffffffffffff44;
  QString *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar7;
  QSqlField *local_a0;
  undefined4 in_stack_ffffffffffffff68;
  bool local_6d;
  QMetaType local_50 [4];
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSqlQueryModel *)0x150f9d);
  if (0 < in_EDX) {
    bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff30);
    if ((!bVar1) && (-1 < in_ESI)) {
      iVar7 = in_ESI;
      iVar2 = QSqlRecord::count((QSqlRecord *)0x150fd7);
      if (iVar7 <= iVar2) {
        beginInsertColumns((QSqlQueryModel *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20)
                           ,(int)in_stack_ffffffffffffff30);
        for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
          memset(local_30,0xaa,0x28);
          QString::QString((QString *)0x151043);
          memset(local_50,0,8);
          QMetaType::QMetaType(local_50);
          QString::QString((QString *)0x15106e);
          type.d_ptr._4_4_ = iVar2;
          type.d_ptr._0_4_ = in_stack_ffffffffffffff68;
          QSqlField::QSqlField
                    ((QSqlField *)CONCAT44(iVar7,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,type,
                     (QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          QString::~QString((QString *)0x15109a);
          QString::~QString((QString *)0x1510a7);
          QSqlField::setReadOnly(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
          QSqlField::setGenerated(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
          QSqlRecord::insert((QSqlRecord *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                             in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff48 =
               (QString *)QVLABaseBase::size((QVLABaseBase *)&pQVar4->colOffsets);
          iVar3 = QSqlRecord::count((QSqlRecord *)0x15110c);
          if ((long)in_stack_ffffffffffffff48 < (long)iVar3) {
            bVar1 = QVarLengthArray<int,_56LL>::isEmpty((QVarLengthArray<int,_56LL> *)0x15112c);
            if (bVar1) {
              in_stack_ffffffffffffff44 = 0;
            }
            else {
              in_stack_ffffffffffffff38 = (QModelIndex *)&pQVar4->colOffsets;
              QVLABaseBase::size((QVLABaseBase *)&pQVar4->colOffsets);
              pvVar5 = QVLABase<int>::operator[]
                                 ((QVLABase<int> *)
                                  CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                                  0x15116c);
              in_stack_ffffffffffffff44 = *pvVar5;
            }
            QVarLengthArray<int,_56LL>::append
                      ((QVarLengthArray<int,_56LL> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       &in_stack_ffffffffffffff38->r);
          }
          local_a0 = (QSqlField *)(long)(in_ESI + 1);
          while( true ) {
            in_stack_ffffffffffffff30 = local_a0;
            sVar6 = QVLABaseBase::size((QVLABaseBase *)&pQVar4->colOffsets);
            if (sVar6 <= (long)in_stack_ffffffffffffff30) break;
            pvVar5 = QVLABase<int>::operator[]
                               ((QVLABase<int> *)
                                CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                                0x1511dc);
            *pvVar5 = *pvVar5 + 1;
            local_a0 = (QSqlField *)((long)&(local_a0->val).d.data + 1);
          }
          QSqlField::~QSqlField(in_stack_ffffffffffffff30);
        }
        endInsertColumns((QSqlQueryModel *)in_stack_ffffffffffffff30);
        local_6d = true;
        goto LAB_0015121f;
      }
    }
  }
  local_6d = false;
LAB_0015121f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_6d;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQueryModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    Q_D(QSqlQueryModel);
    if (count <= 0 || parent.isValid() || column < 0 || column > d->rec.count())
        return false;

    beginInsertColumns(parent, column, column + count - 1);
    for (int c = 0; c < count; ++c) {
        QSqlField field;
        field.setReadOnly(true);
        field.setGenerated(false);
        d->rec.insert(column, field);
        if (d->colOffsets.size() < d->rec.count()) {
            int nVal = d->colOffsets.isEmpty() ? 0 : d->colOffsets[d->colOffsets.size() - 1];
            d->colOffsets.append(nVal);
            Q_ASSERT(d->colOffsets.size() >= d->rec.count());
        }
        for (qsizetype i = column + 1; i < d->colOffsets.size(); ++i)
            ++d->colOffsets[i];
    }
    endInsertColumns();
    return true;
}